

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void av1_filter_intra_predictor_c
               (uint8_t *dst,ptrdiff_t stride,TX_SIZE tx_size,uint8_t *above,uint8_t *left,int mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  long in_RCX;
  byte in_DL;
  long in_RSI;
  void *in_RDI;
  long in_R8;
  int in_R9D;
  int pr;
  int c_offset;
  int r_offset;
  int k;
  uint8_t p6;
  uint8_t p5;
  uint8_t p4;
  uint8_t p3;
  uint8_t p2;
  uint8_t p1;
  uint8_t p0;
  int bh;
  int bw;
  uint8_t buffer [33] [33];
  int c;
  int r;
  uint local_48c;
  byte local_478 [1092];
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  long local_20;
  long local_10;
  void *local_8;
  
  iVar8 = tx_size_wide[in_DL];
  iVar9 = tx_size_high[in_DL];
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < iVar9; local_30 = local_30 + 1) {
    local_478[(long)(local_30 + 1) * 0x21] = *(byte *)(local_28 + local_30);
  }
  memcpy(local_478,(void *)(local_20 + -1),(long)(iVar8 + 1));
  for (local_30 = 1; local_30 < iVar9 + 1; local_30 = local_30 + 2) {
    for (local_34 = 1; local_34 < iVar8 + 1; local_34 = local_34 + 4) {
      bVar1 = local_478[(long)(local_34 + -1) + (long)(local_30 + -1) * 0x21];
      bVar2 = local_478[(long)local_34 + (long)(local_30 + -1) * 0x21];
      bVar3 = local_478[(long)(local_34 + 1) + (long)(local_30 + -1) * 0x21];
      bVar4 = local_478[(long)(local_34 + 2) + (long)(local_30 + -1) * 0x21];
      bVar5 = local_478[(long)(local_34 + 3) + (long)(local_30 + -1) * 0x21];
      bVar6 = local_478[(long)(local_34 + -1) + (long)local_30 * 0x21];
      bVar7 = local_478[(long)(local_34 + -1) + (long)(local_30 + 1) * 0x21];
      for (local_48c = 0; (int)local_48c < 8; local_48c = local_48c + 1) {
        bVar10 = clip_pixel((int)((int)av1_filter_intra_taps[local_2c][(int)local_48c][0] *
                                  (uint)bVar1 +
                                  (int)*(char *)((long)local_2c * 0x40 + 0xc11c01 +
                                                (long)(int)local_48c * 8) * (uint)bVar2 +
                                  (int)*(char *)((long)local_2c * 0x40 + 0xc11c02 +
                                                (long)(int)local_48c * 8) * (uint)bVar3 +
                                  (int)*(char *)((long)local_2c * 0x40 + 0xc11c03 +
                                                (long)(int)local_48c * 8) * (uint)bVar4 +
                                  (int)*(char *)((long)local_2c * 0x40 + 0xc11c04 +
                                                (long)(int)local_48c * 8) * (uint)bVar5 +
                                  (int)*(char *)((long)local_2c * 0x40 + 0xc11c05 +
                                                (long)(int)local_48c * 8) * (uint)bVar6 +
                                  (int)*(char *)((long)local_2c * 0x40 + 0xc11c06 +
                                                (long)(int)local_48c * 8) * (uint)bVar7 + 8) >> 4);
        local_478[(long)(int)(local_34 + (local_48c & 3)) +
                  (long)(local_30 + ((int)local_48c >> 2)) * 0x21] = bVar10;
      }
    }
  }
  for (local_30 = 0; local_30 < iVar9; local_30 = local_30 + 1) {
    memcpy(local_8,local_478 + (long)(local_30 + 1) * 0x21 + 1,(long)iVar8);
    local_8 = (void *)(local_10 + (long)local_8);
  }
  return;
}

Assistant:

void av1_filter_intra_predictor_c(uint8_t *dst, ptrdiff_t stride,
                                  TX_SIZE tx_size, const uint8_t *above,
                                  const uint8_t *left, int mode) {
  int r, c;
  uint8_t buffer[33][33];
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];

  assert(bw <= 32 && bh <= 32);

  for (r = 0; r < bh; ++r) buffer[r + 1][0] = left[r];
  memcpy(buffer[0], &above[-1], (bw + 1) * sizeof(uint8_t));

  for (r = 1; r < bh + 1; r += 2)
    for (c = 1; c < bw + 1; c += 4) {
      const uint8_t p0 = buffer[r - 1][c - 1];
      const uint8_t p1 = buffer[r - 1][c];
      const uint8_t p2 = buffer[r - 1][c + 1];
      const uint8_t p3 = buffer[r - 1][c + 2];
      const uint8_t p4 = buffer[r - 1][c + 3];
      const uint8_t p5 = buffer[r][c - 1];
      const uint8_t p6 = buffer[r + 1][c - 1];
      for (int k = 0; k < 8; ++k) {
        int r_offset = k >> 2;
        int c_offset = k & 0x03;
        int pr = av1_filter_intra_taps[mode][k][0] * p0 +
                 av1_filter_intra_taps[mode][k][1] * p1 +
                 av1_filter_intra_taps[mode][k][2] * p2 +
                 av1_filter_intra_taps[mode][k][3] * p3 +
                 av1_filter_intra_taps[mode][k][4] * p4 +
                 av1_filter_intra_taps[mode][k][5] * p5 +
                 av1_filter_intra_taps[mode][k][6] * p6;
        // Section 7.11.2.3 specifies the right-hand side of the assignment as
        //   Clip1( Round2Signed( pr, INTRA_FILTER_SCALE_BITS ) ).
        // Since Clip1() clips a negative value to 0, it is safe to replace
        // Round2Signed() with Round2().
        buffer[r + r_offset][c + c_offset] =
            clip_pixel(ROUND_POWER_OF_TWO(pr, FILTER_INTRA_SCALE_BITS));
      }
    }

  for (r = 0; r < bh; ++r) {
    memcpy(dst, &buffer[r + 1][1], bw * sizeof(uint8_t));
    dst += stride;
  }
}